

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4.cc
# Opt level: O0

ostream * lf::io::operator<<(ostream *stream,ElementType et)

{
  ElementType et_local;
  ostream *stream_local;
  
  switch(et) {
  case EDGE2:
    std::operator<<(stream,"EDGE2");
    break;
  case TRIA3:
    std::operator<<(stream,"TRIA3");
    break;
  case QUAD4:
    std::operator<<(stream,"QUAD4");
    break;
  case TET4:
    std::operator<<(stream,"TET4");
    break;
  case HEX8:
    std::operator<<(stream,"HEX8");
    break;
  case PRISM6:
    std::operator<<(stream,"PRISM6");
    break;
  case PYRAMID5:
    std::operator<<(stream,"PYRAMID5");
    break;
  case EDGE3:
    std::operator<<(stream,"EDGE3");
    break;
  case TRIA6:
    std::operator<<(stream,"TRIA6");
    break;
  case QUAD9:
    std::operator<<(stream,"QUAD9");
    break;
  case TET10:
    std::operator<<(stream,"TET10");
    break;
  case HEX27:
    std::operator<<(stream,"HEX27");
    break;
  case PRISM18:
    std::operator<<(stream,"PRISM18");
    break;
  case PYRAMID14:
    std::operator<<(stream,"PYRAMID14");
    break;
  case POINT:
    std::operator<<(stream,"POINT");
    break;
  case QUAD8:
    std::operator<<(stream,"QUAD8");
    break;
  case HEX20:
    std::operator<<(stream,"HEX20");
    break;
  case PRISM15:
    std::operator<<(stream,"PRISM15");
    break;
  case PYRAMID13:
    std::operator<<(stream,"PYRAMID13");
    break;
  case TRIA9:
    std::operator<<(stream,"TRIA9");
    break;
  case TRIA10:
    std::operator<<(stream,"TRIA10");
    break;
  case TRIA12:
    std::operator<<(stream,"TRIA12");
    break;
  case TRIA15:
    std::operator<<(stream,"TRIA15");
    break;
  case TRIA15_5:
    std::operator<<(stream,"TRIA15_5");
    break;
  case TRIA21:
    std::operator<<(stream,"TRIA21");
    break;
  case EDGE4:
    std::operator<<(stream,"EDGE4");
    break;
  case EDGE5:
    std::operator<<(stream,"EDGE5");
    break;
  case EDGE6:
    std::operator<<(stream,"EDGE6");
    break;
  case TET20:
    std::operator<<(stream,"TET20");
    break;
  case TET35:
    std::operator<<(stream,"TET35");
    break;
  case TET56:
    std::operator<<(stream,"TET56");
    break;
  default:
    break;
  case HEX64:
    std::operator<<(stream,"HEX64");
    break;
  case HEX125:
    std::operator<<(stream,"HEX125");
  }
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, GMshFileV4::ElementType et) {
  switch (et) {
    default:
      break;
    case GMshFileV4::ElementType::EDGE2:
      stream << "EDGE2";
      break;
    case GMshFileV4::ElementType::TRIA3:
      stream << "TRIA3";
      break;
    case GMshFileV4::ElementType::QUAD4:
      stream << "QUAD4";
      break;
    case GMshFileV4::ElementType::TET4:
      stream << "TET4";
      break;
    case GMshFileV4::ElementType::HEX8:
      stream << "HEX8";
      break;
    case GMshFileV4::ElementType::PRISM6:
      stream << "PRISM6";
      break;
    case GMshFileV4::ElementType::PYRAMID5:
      stream << "PYRAMID5";
      break;
    case GMshFileV4::ElementType::EDGE3:
      stream << "EDGE3";
      break;
    case GMshFileV4::ElementType::TRIA6:
      stream << "TRIA6";
      break;
    case GMshFileV4::ElementType::QUAD9:
      stream << "QUAD9";
      break;
    case GMshFileV4::ElementType::TET10:
      stream << "TET10";
      break;
    case GMshFileV4::ElementType::HEX27:
      stream << "HEX27";
      break;
    case GMshFileV4::ElementType::PRISM18:
      stream << "PRISM18";
      break;
    case GMshFileV4::ElementType::PYRAMID14:
      stream << "PYRAMID14";
      break;
    case GMshFileV4::ElementType::POINT:
      stream << "POINT";
      break;
    case GMshFileV4::ElementType::QUAD8:
      stream << "QUAD8";
      break;
    case GMshFileV4::ElementType::HEX20:
      stream << "HEX20";
      break;
    case GMshFileV4::ElementType::PRISM15:
      stream << "PRISM15";
      break;
    case GMshFileV4::ElementType::PYRAMID13:
      stream << "PYRAMID13";
      break;
    case GMshFileV4::ElementType::TRIA9:
      stream << "TRIA9";
      break;
    case GMshFileV4::ElementType::TRIA10:
      stream << "TRIA10";
      break;
    case GMshFileV4::ElementType::TRIA12:
      stream << "TRIA12";
      break;
    case GMshFileV4::ElementType::TRIA15:
      stream << "TRIA15";
      break;
    case GMshFileV4::ElementType::TRIA15_5:
      stream << "TRIA15_5";
      break;
    case GMshFileV4::ElementType::TRIA21:
      stream << "TRIA21";
      break;
    case GMshFileV4::ElementType::EDGE4:
      stream << "EDGE4";
      break;
    case GMshFileV4::ElementType::EDGE5:
      stream << "EDGE5";
      break;
    case GMshFileV4::ElementType::EDGE6:
      stream << "EDGE6";
      break;
    case GMshFileV4::ElementType::TET20:
      stream << "TET20";
      break;
    case GMshFileV4::ElementType::TET35:
      stream << "TET35";
      break;
    case GMshFileV4::ElementType::TET56:
      stream << "TET56";
      break;
    case GMshFileV4::ElementType::HEX64:
      stream << "HEX64";
      break;
    case GMshFileV4::ElementType::HEX125:
      stream << "HEX125";
      break;
  }
  return stream;
}